

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_image::set_block_pixels
          (dxt_image *this,uint block_x,uint block_y,color_quad_u8 *pPixels,pack_params *p)

{
  set_block_pixels_context context;
  set_block_pixels_context local_f30;
  
  set_block_pixels_context::set_block_pixels_context(&local_f30);
  set_block_pixels(this,block_x,block_y,pPixels,p,&local_f30);
  set_block_pixels_context::~set_block_pixels_context(&local_f30);
  return;
}

Assistant:

void dxt_image::set_block_pixels(uint block_x, uint block_y, const color_quad_u8* pPixels, const pack_params& p) {
  set_block_pixels_context context;
  set_block_pixels(block_x, block_y, pPixels, p, context);
}